

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::FormattingScene::Texture
          (FormattingScene *this,string *name,string *type,string *texname,
          ParsedParameterVector params,FileLoc loc)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  size_t sVar4;
  char *pcVar5;
  double *pdVar6;
  long lVar7;
  FormattingScene *pFVar8;
  string *args_3;
  int iVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  undefined8 *puVar12;
  undefined8 uVar13;
  undefined8 extraout_RAX;
  ostream *poVar14;
  size_type *psVar15;
  char *pcVar16;
  uint uVar17;
  long lVar18;
  undefined1 *puVar19;
  _Alloc_hider _Var20;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_R8;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar21;
  Float gamma;
  string extra;
  ParameterDictionary dict;
  string local_1b8;
  string local_198;
  string *local_178;
  FormattingScene *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  long local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *local_148;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_140;
  string *local_138;
  float local_12c;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_128;
  long local_120;
  memory_resource local_118 [2];
  ulong local_108;
  string *local_100;
  ParameterDictionary local_f8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_90;
  
  local_140 = in_R8;
  local_138 = type;
  if (this->upgrade == true) {
    this_00 = &this->definedTextures;
    iVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)this_00,name);
    if (iVar10._M_node == (_Base_ptr)&this->field_0x20) {
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_00,name);
      std::__cxx11::string::_M_assign((string *)pmVar11);
    }
    else {
      paVar21 = &local_f8.params.field_2;
      local_f8.params.ptr = (ParsedParameter **)0x0;
      local_f8.params.field_2._0_1_ = 0;
      local_f8.params.alloc.memoryResource = (memory_resource *)paVar21;
      detail::stringPrintfRecursive<std::__cxx11::string_const&>
                ((string *)&local_f8,"%s: renaming multiply-defined texture",name);
      Warning((FileLoc *)&params,(char *)local_f8.params.alloc.memoryResource);
      if ((anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
           *)local_f8.params.alloc.memoryResource != paVar21) {
        operator_delete(local_f8.params.alloc.memoryResource,
                        CONCAT71(local_f8.params.field_2._1_7_,local_f8.params.field_2._0_1_) + 1);
      }
      local_128.memoryResource._0_4_ = Texture::count;
      local_f8.params.ptr = (ParsedParameter **)0x0;
      local_f8.params.field_2._0_1_ = 0;
      Texture::count = Texture::count + 1;
      local_f8.params.alloc.memoryResource = (memory_resource *)paVar21;
      detail::stringPrintfRecursive<std::__cxx11::string_const&,int>
                ((string *)&local_f8,"%s-renamed-%d",name,(int *)&local_128);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_00,name);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_f8);
      if ((anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
           *)local_f8.params.alloc.memoryResource != paVar21) {
        operator_delete(local_f8.params.alloc.memoryResource,
                        CONCAT71(local_f8.params.field_2._1_7_,local_f8.params.field_2._0_1_) + 1);
      }
    }
  }
  local_178 = name;
  local_170 = this;
  local_100 = texname;
  if ((this->upgrade == true) &&
     (iVar9 = std::__cxx11::string::compare((char *)texname), iVar9 == 0)) {
    iVar9 = std::__cxx11::string::compare((char *)local_138);
    sVar4 = local_140->nStored;
    paVar21 = &local_140->field_2;
    if ((anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
         *)local_140->ptr !=
        (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
         *)0x0) {
      paVar21 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)local_140->ptr;
    }
    if (iVar9 == 0) {
      if (sVar4 != 0) {
        lVar18 = 0;
        do {
          lVar7 = *(long *)((long)paVar21 + lVar18);
          pcVar5 = (char *)(lVar7 + 0x20);
          iVar9 = std::__cxx11::string::compare(pcVar5);
          if (iVar9 == 0) {
            std::__cxx11::string::_M_replace((ulong)pcVar5,0,*(char **)(lVar7 + 0x28),0x2ea4076);
          }
          iVar9 = std::__cxx11::string::compare(pcVar5);
          if (iVar9 == 0) {
            std::__cxx11::string::_M_replace((ulong)pcVar5,0,*(char **)(lVar7 + 0x28),0x5e298d);
          }
          lVar18 = lVar18 + 8;
        } while (sVar4 << 3 != lVar18);
      }
    }
    else if (sVar4 != 0) {
      lVar18 = 0;
      local_108 = 0;
      local_148 = (vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)0x0;
      do {
        pcVar5 = *(char **)((long)paVar21 + lVar18);
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pcVar5 + 0x20);
        iVar9 = std::__cxx11::string::compare((char *)args);
        if (iVar9 == 0) {
LAB_005306a8:
          iVar9 = std::__cxx11::string::compare(pcVar5);
          if (iVar9 == 0) {
            if (((ulong)local_148 & 1) != 0) {
              pcVar16 = 
              "Two \"rgb\" textures found for \"scale\" texture \"%s\". Please manually edit the file to upgrade."
              ;
              goto LAB_005306f4;
            }
            if (*(long *)(pcVar5 + 0x70) == 3) {
              pdVar6 = *(double **)(pcVar5 + 0x60);
              dVar3 = pdVar6[1];
              if (*pdVar6 == dVar3) {
                if ((dVar3 == pdVar6[2]) && (!NAN(dVar3) && !NAN(pdVar6[2]))) {
                  local_148 = (vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)
                              (pcVar5 + 0x58);
                  uVar17 = 0;
                  std::__cxx11::string::_M_replace((ulong)pcVar5,0,*(char **)(pcVar5 + 8),0x5e37ac);
                  std::__cxx11::string::_M_replace((ulong)args,0,*(char **)(pcVar5 + 0x28),0x5e298d)
                  ;
                  pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::resize
                            (local_148,1);
                  local_148 = (vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)
                              CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                  goto LAB_00530783;
                }
              }
              pcVar16 = 
              "Non-constant \"rgb\" value found for \"scale\" texture parameter \"%s\". Please manually edit the file to upgrade."
              ;
            }
            else {
              pcVar16 = "Didn\'t find 3 values for \"rgb\" \"%s\".";
            }
            SceneRepresentation::ErrorExitDeferred<std::__cxx11::string&>
                      (&local_170->super_SceneRepresentation,(FileLoc *)(pcVar5 + 0x40),pcVar16,args
                      );
          }
          else {
            if ((local_108 & 1) == 0) {
              uVar17 = 0;
              uVar13 = std::__cxx11::string::_M_replace
                                 ((ulong)args,0,*(char **)(pcVar5 + 0x28),0x2ea4076);
              local_108 = CONCAT71((int7)((ulong)uVar13 >> 8),1);
              goto LAB_00530783;
            }
            pcVar16 = 
            "Two textures found for \"scale\" texture \"%s\". Please manually edit the file to upgrade."
            ;
LAB_005306f4:
            SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                      (&local_170->super_SceneRepresentation,(FileLoc *)(pcVar5 + 0x40),pcVar16,
                       local_178);
          }
          uVar17 = 1;
        }
        else {
          iVar9 = std::__cxx11::string::compare((char *)args);
          uVar17 = 5;
          if (iVar9 == 0) goto LAB_005306a8;
        }
LAB_00530783:
        if ((uVar17 != 5) && (uVar17 != 0)) goto LAB_00530884;
        lVar18 = lVar18 + 8;
      } while (sVar4 << 3 != lVar18);
      uVar17 = 0;
LAB_00530884:
      if ((uVar17 & 3) != 0) {
        return;
      }
    }
  }
  local_128.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_90,local_140,&local_128);
  ParameterDictionary::ParameterDictionary(&local_f8,&local_90,RGBColorSpace::sRGB);
  local_90.nStored = 0;
  (*(local_90.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_90.alloc.memoryResource,local_90.ptr,local_90.nAlloc << 3,8);
  args_3 = local_100;
  pFVar8 = local_170;
  if (local_170->upgrade == true) {
    ParameterDictionary::RenameUsedTextures(&local_f8,&local_170->definedTextures);
  }
  local_120 = 0;
  local_118[0]._vptr_memory_resource._0_1_ = 0;
  local_128.memoryResource = local_118;
  if (pFVar8->upgrade != true) goto LAB_00530cf0;
  iVar9 = std::__cxx11::string::compare((char *)args_3);
  if (iVar9 == 0) {
    paVar1 = &local_1b8.field_2;
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"trilinear","");
    ParameterDictionary::GetBoolArray
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_198,&local_f8,
               &local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if (local_198._M_string_length - (long)local_198._M_dataplus._M_p == 1) {
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"trilinear","");
      ParameterDictionary::RemoveBool(&local_f8,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      local_168 = &local_158;
      std::__cxx11::string::_M_construct
                ((ulong)&local_168,
                 (char)*(undefined4 *)&(pFVar8->super_SceneRepresentation).field_0xc + '\x04');
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
      psVar15 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_1b8.field_2._M_allocated_capacity = *psVar15;
        local_1b8.field_2._8_8_ = puVar12[3];
        local_1b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1b8.field_2._M_allocated_capacity = *psVar15;
        local_1b8._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_1b8._M_string_length = puVar12[1];
      *puVar12 = psVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_1b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if (local_168 != &local_158) {
        operator_delete(local_168,(ulong)(local_158._M_allocated_capacity + 1));
      }
      std::__cxx11::string::append((char *)&local_128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                               local_198.field_2._M_local_buf[0]) - (long)local_198._M_dataplus._M_p
                     );
    }
  }
  iVar9 = std::__cxx11::string::compare((char *)args_3);
  if ((iVar9 != 0) && (iVar9 = std::__cxx11::string::compare((char *)args_3), iVar9 != 0))
  goto LAB_00530cf0;
  paVar1 = &local_1b8.field_2;
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"gamma","");
  local_12c = ParameterDictionary::GetOneFloat(&local_f8,&local_1b8,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    local_140 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 *)CONCAT44(local_140._4_4_,local_12c);
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    local_12c = SUB84(local_140,0);
  }
  if ((local_12c != 0.0) || (NAN(local_12c))) {
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"gamma","");
    ParameterDictionary::RemoveFloat(&local_f8,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    local_168 = &local_158;
    std::__cxx11::string::_M_construct
              ((ulong)&local_168,
               (char)*(undefined4 *)&(pFVar8->super_SceneRepresentation).field_0xc + '\x04');
    paVar2 = &local_198.field_2;
    local_198._M_string_length = 0;
    local_198.field_2._M_local_buf[0] = '\0';
    local_198._M_dataplus._M_p = (pointer)paVar2;
    detail::stringPrintfRecursive<float&>
              (&local_198,"\"string encoding \" \"gamma %f\" ",&local_12c);
    uVar13 = &DAT_0000000f;
    if (local_168 != &local_158) {
      uVar13 = local_158._M_allocated_capacity;
    }
    if ((ulong)uVar13 < (undefined1 *)(local_198._M_string_length + local_160)) {
      puVar19 = &DAT_0000000f;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar2) {
        puVar19 = (undefined1 *)
                  CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                           local_198.field_2._M_local_buf[0]);
      }
      if (puVar19 < (undefined1 *)(local_198._M_string_length + local_160)) goto LAB_00530a9c;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_168);
    }
    else {
LAB_00530a9c:
      puVar12 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_168,(ulong)local_198._M_dataplus._M_p);
    }
    psVar15 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_1b8.field_2._M_allocated_capacity = *psVar15;
      local_1b8.field_2._8_8_ = puVar12[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar15;
      local_1b8._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_1b8._M_string_length = puVar12[1];
    *puVar12 = psVar15;
    puVar12[1] = 0;
    *(undefined1 *)psVar15 = 0;
    std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_1b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar2) {
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                               local_198.field_2._M_local_buf[0]) + 1);
    }
    if (local_168 == &local_158) goto LAB_00530cf0;
    puVar19 = (undefined1 *)(local_158._M_allocated_capacity + 1);
    _Var20._M_p = (pointer)local_168;
  }
  else {
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"gamma","");
    ParameterDictionary::GetBoolArray
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_198,&local_f8,
               &local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if (local_198._M_string_length - (long)local_198._M_dataplus._M_p == 1) {
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"gamma","");
      ParameterDictionary::RemoveBool(&local_f8,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      local_168 = &local_158;
      std::__cxx11::string::_M_construct
                ((ulong)&local_168,
                 (char)*(undefined4 *)&(pFVar8->super_SceneRepresentation).field_0xc + '\x04');
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
      psVar15 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_1b8.field_2._M_allocated_capacity = *psVar15;
        local_1b8.field_2._8_8_ = puVar12[3];
        local_1b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1b8.field_2._M_allocated_capacity = *psVar15;
        local_1b8._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_1b8._M_string_length = puVar12[1];
      *puVar12 = psVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_1b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if (local_168 != &local_158) {
        operator_delete(local_168,(ulong)(local_158._M_allocated_capacity + 1));
      }
      std::__cxx11::string::append((char *)&local_128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_00530cf0;
    puVar19 = (undefined1 *)
              (CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                        local_198.field_2._M_local_buf[0]) - (long)local_198._M_dataplus._M_p);
    _Var20._M_p = local_198._M_dataplus._M_p;
  }
  operator_delete(_Var20._M_p,(ulong)puVar19);
LAB_00530cf0:
  if (pFVar8->upgrade == true) {
    iVar9 = std::__cxx11::string::compare((char *)local_138);
    if (iVar9 == 0) {
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_1b8,
                 (char)*(undefined4 *)&(pFVar8->super_SceneRepresentation).field_0xc);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&pFVar8->definedTextures,local_178);
      Printf<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string_const&>
                ("%sTexture \"%s\" \"spectrum\" \"%s\"\n",&local_1b8,pmVar11,args_3);
    }
    else {
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_1b8,
                 (char)*(undefined4 *)&(pFVar8->super_SceneRepresentation).field_0xc);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&pFVar8->definedTextures,local_178);
      Printf<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ("%sTexture \"%s\" \"%s\" \"%s\"\n",&local_1b8,pmVar11,local_138,args_3);
    }
  }
  else {
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_1b8,(char)*(undefined4 *)&(pFVar8->super_SceneRepresentation).field_0xc
              );
    Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
              ("%sTexture \"%s\" \"%s\" \"%s\"\n",&local_1b8,local_178,local_138,args_3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_128.memoryResource,local_120);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&local_1b8,&local_f8,*(int *)&(pFVar8->super_SceneRepresentation).field_0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_128.memoryResource != local_118) {
    operator_delete(local_128.memoryResource,
                    CONCAT71(local_118[0]._vptr_memory_resource._1_7_,
                             local_118[0]._vptr_memory_resource._0_1_) + 1);
  }
  local_f8.params.nStored = 0;
  (**(code **)((long)&(((anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                         *)&(local_f8.params.alloc.memoryResource)->_vptr_memory_resource)->fixed[0]
                      ->type).field_2 + 8))
            (local_f8.params.alloc.memoryResource,local_f8.params.ptr,local_f8.params.nAlloc << 3,8)
  ;
  return;
}

Assistant:

void FormattingScene::Texture(const std::string &name, const std::string &type,
                              const std::string &texname, ParsedParameterVector params,
                              FileLoc loc) {
    if (upgrade) {
        if (definedTextures.find(name) != definedTextures.end()) {
            static int count = 0;
            Warning(&loc, "%s: renaming multiply-defined texture", name);
            definedTextures[name] = StringPrintf("%s-renamed-%d", name, count++);
        } else
            definedTextures[name] = name;
    }

    if (upgrade && texname == "scale") {
        // This is easier to do in the raw ParsedParameterVector...
        if (type == "float") {
            for (ParsedParameter *p : params) {
                if (p->name == "tex1")
                    p->name = "tex";
                if (p->name == "tex2")
                    p->name = "scale";
            }
        } else {
            // more subtle: rename one of them as float, but need one of them
            // to be an RGB and spectrally constant...
            bool foundRGB = false, foundTexture = false;
            for (ParsedParameter *p : params) {
                if (p->name != "tex1" && p->name != "tex2")
                    continue;

                if (p->type == "rgb") {
                    if (foundRGB) {
                        ErrorExitDeferred(
                            &p->loc,
                            "Two \"rgb\" textures found for \"scale\" "
                            "texture \"%s\". Please manually edit the file to "
                            "upgrade.",
                            name);
                        return;
                    }
                    if (p->numbers.size() != 3) {
                        ErrorExitDeferred(
                            &p->loc, "Didn't find 3 values for \"rgb\" \"%s\".", p->name);
                        return;
                    }
                    if (p->numbers[0] != p->numbers[1] ||
                        p->numbers[1] != p->numbers[2]) {
                        ErrorExitDeferred(&p->loc,
                                          "Non-constant \"rgb\" value found for "
                                          "\"scale\" texture parameter \"%s\". Please "
                                          "manually "
                                          "edit the file to upgrade.",
                                          p->name);
                        return;
                    }

                    foundRGB = true;
                    p->type = "float";
                    p->name = "scale";
                    p->numbers.resize(1);
                } else {
                    if (foundTexture) {
                        ErrorExitDeferred(
                            &p->loc,
                            "Two textures found for \"scale\" "
                            "texture \"%s\". Please manually edit the file to "
                            "upgrade.",
                            name);
                        return;
                    }
                    p->name = "tex";
                    foundTexture = true;
                }
            }
        }
    }

    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    if (upgrade)
        dict.RenameUsedTextures(definedTextures);

    std::string extra;
    if (upgrade) {
        if (texname == "imagemap") {
            std::vector<uint8_t> tri = dict.GetBoolArray("trilinear");
            if (tri.size() == 1) {
                dict.RemoveBool("trilinear");
                extra += indent(1) + "\"string filter\" ";
                extra += tri[0] != 0u ? "\"trilinear\"\n" : "\"bilinear\"\n";
            }
        }

        if (texname == "imagemap" || texname == "ptex") {
            Float gamma = dict.GetOneFloat("gamma", 0);
            if (gamma != 0) {
                dict.RemoveFloat("gamma");
                extra +=
                    indent(1) + StringPrintf("\"string encoding \" \"gamma %f\" ", gamma);
            } else {
                std::vector<uint8_t> gamma = dict.GetBoolArray("gamma");
                if (gamma.size() == 1) {
                    dict.RemoveBool("gamma");
                    extra += indent(1) + "\"string encoding\" ";
                    extra += gamma[0] != 0u ? "\"sRGB\"\n" : "\"linear\"\n";
                }
            }
        }
    }

    if (upgrade) {
        if (type == "color")
            Printf("%sTexture \"%s\" \"spectrum\" \"%s\"\n", indent(),
                   definedTextures[name], texname);
        else
            Printf("%sTexture \"%s\" \"%s\" \"%s\"\n", indent(), definedTextures[name],
                   type, texname);
    } else
        Printf("%sTexture \"%s\" \"%s\" \"%s\"\n", indent(), name, type, texname);

    std::cout << extra << dict.ToParameterList(catIndentCount);
}